

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<duckdb_string_t,_Catch::Matchers::Generic::PredicateMatcher<duckdb_string_t>_>::
streamReconstructedExpression
          (MatchExpr<duckdb_string_t,_Catch::Matchers::Generic::PredicateMatcher<duckdb_string_t>_>
           *this,ostream *os)

{
  __type_conflict _Var1;
  ostream *poVar2;
  string matcherAsString;
  string local_30 [32];
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&matcherAsString,(MatcherUntypedBase *)&this->m_matcher);
  std::__cxx11::string::string(local_30,(string *)Detail::unprintableString_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)os,local_30);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string(local_30);
  _Var1 = std::operator==(&matcherAsString,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Detail::unprintableString_abi_cxx11_);
  if (_Var1) {
    Catch::operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
    std::operator<<((ostream *)os,(string *)&matcherAsString);
  }
  std::__cxx11::string::~string((string *)&matcherAsString);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }